

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int bitset_container_number_of_runs(bitset_container_t *bc)

{
  ulong uVar1;
  int iVar2;
  long in_RDI;
  uint64_t word;
  uint64_t word_1;
  int i;
  uint64_t next_word;
  int num_runs;
  undefined4 local_1c;
  undefined8 local_18;
  undefined4 local_c;
  
  local_c = 0;
  local_18 = **(ulong **)(in_RDI + 8);
  for (local_1c = 0; local_1c < 0x3ff; local_1c = local_1c + 1) {
    uVar1 = *(ulong *)(*(long *)(in_RDI + 8) + (long)(local_1c + 1) * 8);
    iVar2 = roaring_hamming((local_18 ^ 0xffffffffffffffff) & local_18 << 1);
    local_c = local_c + iVar2 + ((uint)(local_18 >> 0x3f) & ((uint)uVar1 ^ 0xffffffff));
    local_18 = uVar1;
  }
  iVar2 = roaring_hamming((local_18 ^ 0xffffffffffffffff) & local_18 << 1);
  local_c = iVar2 + local_c;
  if ((local_18 & 0x8000000000000000) != 0) {
    local_c = local_c + 1;
  }
  return local_c;
}

Assistant:

int bitset_container_number_of_runs(bitset_container_t *bc) {
  int num_runs = 0;
  uint64_t next_word = bc->words[0];

  for (int i = 0; i < BITSET_CONTAINER_SIZE_IN_WORDS-1; ++i) {
    uint64_t word = next_word;
    next_word = bc->words[i+1];
    num_runs += roaring_hamming((~word) & (word << 1)) + ( (word >> 63) & ~next_word);
  }

  uint64_t word = next_word;
  num_runs += roaring_hamming((~word) & (word << 1));
  if((word & 0x8000000000000000ULL) != 0)
    num_runs++;
  return num_runs;
}